

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall google::protobuf::RepeatedField<double>::UnpoisonBuffer(RepeatedField<double> *this)

{
  int iVar1;
  
  iVar1 = internal::SooRep::size
                    (&this->soo_rep_,
                     (undefined1  [16])
                     ((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                     (undefined1  [16])0x0);
  if (((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) !=
       (undefined1  [16])0x0) && (iVar1 != (this->soo_rep_).field_0.long_rep.capacity)) {
    internal::LongSooRep::elements((LongSooRep *)this);
    return;
  }
  return;
}

Assistant:

void UnpoisonBuffer() const {
    AnnotateSize(size(), Capacity());
    if (is_soo()) {
      // We need to manually unpoison the SOO buffer because in reflection for
      // split repeated fields, we poison the whole SOO buffer even when we
      // don't actually use the whole SOO buffer (e.g. for RepeatedField<bool>).
      internal::UnpoisonMemoryRegion(soo_rep_.short_rep.data,
                                     sizeof(soo_rep_.short_rep.data));
    }
  }